

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBSTSStep5(octet *in,size_t in_len,bake_certval_i valb,void *state)

{
  ulong n_00;
  long lVar1;
  bool_t bVar2;
  int iVar3;
  err_t eVar4;
  word *b;
  word *a;
  word *stack_00;
  word *a_00;
  long *in_RCX;
  code *in_RDX;
  ulong in_RSI;
  void *in_RDI;
  blob_t Yb;
  void *stack;
  octet *block1;
  word *sb;
  word *Qb;
  size_t no;
  size_t n;
  bake_bsts_o *s;
  err_t code;
  octet *in_stack_ffffffffffffff68;
  u64 *in_stack_ffffffffffffff70;
  octet *in_stack_ffffffffffffff78;
  ec_o *in_stack_ffffffffffffff80;
  err_t local_34;
  
  bVar2 = objIsOperable(in_stack_ffffffffffffff68);
  if (bVar2 == 0) {
    return 0x6d;
  }
  n_00 = *(ulong *)(*(long *)(in_RCX[3] + 0x18) + 0x30);
  lVar1 = *(long *)(*(long *)(in_RCX[3] + 0x18) + 0x38);
  if (((in_RSI <= lVar1 + 8U) || (bVar2 = memIsValid(in_RDI,in_RSI), bVar2 == 0)) ||
     (in_RDX == (code *)0x0)) {
    return 0x6d;
  }
  b = (word *)((long)in_RCX + *in_RCX);
  a = b + n_00 * 2;
  stack_00 = a + n_00;
  memSet(in_stack_ffffffffffffff70,(octet)((ulong)in_stack_ffffffffffffff68 >> 0x38),0x11f165);
  beltMACStart(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70
              );
  beltMACStepA(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
  beltMACStepA(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
  bVar2 = beltMACStepV((octet *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar2 == 0) {
    return 0x209;
  }
  a_00 = (word *)blobCreate((size_t)in_stack_ffffffffffffff68);
  if (a_00 == (word *)0x0) {
    return 0x6e;
  }
  memCopy(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x11f229);
  beltCFBStart(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70
               ,in_stack_ffffffffffffff68);
  beltCFBStepD(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
              );
  u64From(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x11f271);
  iVar3 = wwCmp(a,*(word **)(in_RCX[3] + 0x38),n_00);
  if (-1 < iVar3) {
    blobClose((blob_t)0x11f29c);
    return 0x209;
  }
  eVar4 = (*in_RDX)(b,in_RCX + 8,(long)a_00 + lVar1,(in_RSI - 8) - lVar1);
  if (eVar4 != 0) {
    blobClose((blob_t)0x11f2ea);
    return eVar4;
  }
  iVar3 = (**(code **)(*(long *)(in_RCX[3] + 0x18) + 0x40))
                    (b,b,*(undefined8 *)(in_RCX[3] + 0x18),stack_00);
  if (((iVar3 == 0) ||
      (iVar3 = (**(code **)(*(long *)(in_RCX[3] + 0x18) + 0x40))
                         (b + n_00,(long)b + lVar1,*(undefined8 *)(in_RCX[3] + 0x18),stack_00),
      iVar3 == 0)) ||
     (bVar2 = ecpIsOnA(a_00,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), local_34 = 0,
     bVar2 == 0)) {
    local_34 = 0x202;
  }
  blobClose((blob_t)0x11f3a2);
  if (local_34 != 0) {
    return local_34;
  }
  bVar2 = ecAddMulA(b,(ec_o *)in_RCX[3],stack_00,2,*(undefined8 *)(in_RCX[3] + 0x30),a,n_00,b,
                    in_RCX[6],(n_00 >> 1) + 1);
  if (bVar2 == 0) {
    return 0x1f6;
  }
  bVar2 = wwEq(b,(word *)in_RCX[7],n_00 << 1);
  if (bVar2 == 0) {
    return 0x209;
  }
  return 0;
}

Assistant:

err_t bakeBSTSStep5(const octet in[], size_t in_len, bake_certval_i valb,
	void* state)
{
	err_t code;
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	// стек
	word* Qb;			/* [2 * n] */
	word* sb;			/* [n] */
	octet* block1;		/* [16] (совпадает с Qb) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (in_len <= no + 8 ||
		!memIsValid(in, in_len) ||
		valb == 0)
		return ERR_BAD_INPUT;
	// раскладка стека
	Qb = objEnd(s, word);
	sb = Qb + 2 * n;
	stack = sb + n;
	block1 = (octet*)Qb;
	// Tb == beltMAC(Yb || 1^128, K1)?
	memSet(block1, 0xFF, 16);
	beltMACStart(stack, s->K1, 32);
	beltMACStepA(in, in_len - 8, stack);
	beltMACStepA(block1, 16, stack);
	if (!beltMACStepV(in + in_len - 8, stack))
		return ERR_AUTH;
	// обработать Yb = [in_len - 8]in
	in_len -= 8;
	{
		blob_t Yb;
		// sb || certb <- beltCFBDecr(Yb, K2, 1^128)
		if ((Yb = blobCreate(in_len)) == 0)
			return ERR_OUTOFMEMORY;
		memCopy(Yb, in, in_len);
		beltCFBStart(stack, s->K2, 32, block1);
		beltCFBStepD(Yb, in_len, stack);
		// sb \in {0, 1,..., q - 1}?
		wwFrom(sb, Yb, no);
		if (wwCmp(sb, s->ec->order, n) >= 0)
		{
			blobClose(Yb);
			return ERR_AUTH;
		}
		// проверить certa
		code = valb((octet*)Qb, s->params, (octet*)Yb + no, in_len - no);
		ERR_CALL_HANDLE(code, blobClose(Yb));
		if (!qrFrom(ecX(Qb), (octet*)Qb, s->ec->f, stack) ||
			!qrFrom(ecY(Qb, n), (octet*)Qb + no, s->ec->f, stack) ||
			!ecpIsOnA(Qb, s->ec, stack))
			code = ERR_BAD_CERT;
		blobClose(Yb);
		ERR_CALL_CHECK(code);
	}
	// sb G + (2^l + t)Qa == Vb?
	if (!ecAddMulA(Qb, s->ec, stack, 2, s->ec->base, sb, n,
		Qb, s->t, n / 2 + 1))
		return ERR_BAD_PARAMS;
	if (!wwEq(Qb, s->Vb, 2 * n))
		return ERR_AUTH;
	// все нормально
	return ERR_OK;
}